

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_debug_vui_parameters(sps_t *sps,bs_t *b)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint32_t r;
  uint32_t r_2;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  FILE *pFVar8;
  uint uVar9;
  int iVar10;
  uint32_t r_1;
  uint uVar11;
  bool bVar12;
  
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar5 = 0;
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left - 1;
  b->bits_left = uVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    uVar5 = (ulong)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
  }
  if (uVar2 == 0) {
    b->p = pbVar1 + 1;
    b->bits_left = 8;
  }
  (sps->vui).aspect_ratio_info_present_flag = (int)uVar5;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.aspect_ratio_info_present_flag: %d \n",uVar5);
  if ((sps->vui).aspect_ratio_info_present_flag != 0) {
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar2 = b->bits_left;
    if (uVar2 == 8) {
      pbVar1 = b->p;
      pbVar7 = b->end;
      if (pbVar7 <= pbVar1) goto LAB_00134e15;
      uVar11 = (uint)*pbVar1;
      b->p = pbVar1 + 1;
    }
    else {
      pbVar1 = b->p;
      pbVar7 = b->end;
LAB_00134e15:
      uVar11 = 0;
      iVar3 = 7;
      do {
        uVar2 = uVar2 - 1;
        b->bits_left = uVar2;
        uVar9 = 0;
        if (pbVar1 < pbVar7) {
          uVar9 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
        }
        if (uVar2 == 0) {
          pbVar1 = pbVar1 + 1;
          b->p = pbVar1;
          b->bits_left = 8;
          uVar2 = 8;
        }
        uVar11 = uVar11 | uVar9 << ((byte)iVar3 & 0x1f);
        bVar12 = iVar3 != 0;
        iVar3 = iVar3 + -1;
      } while (bVar12);
    }
    (sps->vui).aspect_ratio_idc = uVar11;
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    fprintf(pFVar8,"sps->vui.aspect_ratio_idc: %d \n");
    if ((sps->vui).aspect_ratio_idc == 0xff) {
      pFVar8 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar8 = _stdout;
      }
      uVar11 = 0;
      fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar1 = b->p;
      uVar2 = b->bits_left;
      iVar3 = 0xf;
      do {
        uVar2 = uVar2 - 1;
        b->bits_left = uVar2;
        uVar9 = 0;
        if (pbVar1 < b->end) {
          uVar9 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
        }
        if (uVar2 == 0) {
          pbVar1 = pbVar1 + 1;
          b->p = pbVar1;
          b->bits_left = 8;
          uVar2 = 8;
        }
        uVar11 = uVar11 | uVar9 << ((byte)iVar3 & 0x1f);
        bVar12 = iVar3 != 0;
        iVar3 = iVar3 + -1;
      } while (bVar12);
      (sps->vui).sar_width = uVar11;
      pFVar8 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar8 = _stdout;
      }
      uVar2 = 0;
      fprintf(pFVar8,"sps->vui.sar_width: %d \n",(ulong)uVar11);
      pFVar8 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar8 = _stdout;
      }
      fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar1 = b->p;
      uVar11 = b->bits_left;
      iVar3 = 0xf;
      do {
        uVar11 = uVar11 - 1;
        b->bits_left = uVar11;
        uVar9 = 0;
        if (pbVar1 < b->end) {
          uVar9 = (uint)((*pbVar1 >> (uVar11 & 0x1f) & 1) != 0);
        }
        if (uVar11 == 0) {
          pbVar1 = pbVar1 + 1;
          b->p = pbVar1;
          b->bits_left = 8;
          uVar11 = 8;
        }
        uVar2 = uVar2 | uVar9 << ((byte)iVar3 & 0x1f);
        bVar12 = iVar3 != 0;
        iVar3 = iVar3 + -1;
      } while (bVar12);
      (sps->vui).sar_height = uVar2;
      pFVar8 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar8 = _stdout;
      }
      fprintf(pFVar8,"sps->vui.sar_height: %d \n",(ulong)uVar2);
    }
  }
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar5 = 0;
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left - 1;
  b->bits_left = uVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    uVar5 = (ulong)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
  }
  if (uVar2 == 0) {
    b->p = pbVar1 + 1;
    b->bits_left = 8;
  }
  (sps->vui).overscan_info_present_flag = (int)uVar5;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.overscan_info_present_flag: %d \n",uVar5);
  if ((sps->vui).overscan_info_present_flag != 0) {
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    uVar5 = 0;
    fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar2 = b->bits_left - 1;
    b->bits_left = uVar2;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      uVar5 = (ulong)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
    }
    if (uVar2 == 0) {
      b->p = pbVar1 + 1;
      b->bits_left = 8;
    }
    (sps->vui).overscan_appropriate_flag = (int)uVar5;
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    fprintf(pFVar8,"sps->vui.overscan_appropriate_flag: %d \n",uVar5);
  }
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar5 = 0;
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left - 1;
  b->bits_left = uVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    uVar5 = (ulong)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
  }
  if (uVar2 == 0) {
    b->p = pbVar1 + 1;
    b->bits_left = 8;
  }
  (sps->vui).video_signal_type_present_flag = (int)uVar5;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.video_signal_type_present_flag: %d \n",uVar5);
  if ((sps->vui).video_signal_type_present_flag == 0) goto LAB_00135579;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar11 = 0;
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar1 = b->p;
  uVar2 = b->bits_left;
  iVar3 = 2;
  do {
    uVar2 = uVar2 - 1;
    b->bits_left = uVar2;
    uVar9 = 0;
    if (pbVar1 < b->end) {
      uVar9 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
    }
    if (uVar2 == 0) {
      pbVar1 = pbVar1 + 1;
      b->p = pbVar1;
      b->bits_left = 8;
      uVar2 = 8;
    }
    uVar11 = uVar11 | uVar9 << ((byte)iVar3 & 0x1f);
    bVar12 = iVar3 != 0;
    iVar3 = iVar3 + -1;
  } while (bVar12);
  (sps->vui).video_format = uVar11;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar5 = 0;
  fprintf(pFVar8,"sps->vui.video_format: %d \n",(ulong)uVar11);
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left - 1;
  b->bits_left = uVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    uVar5 = (ulong)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
  }
  if (uVar2 == 0) {
    b->p = pbVar1 + 1;
    b->bits_left = 8;
  }
  (sps->vui).video_full_range_flag = (int)uVar5;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar6 = 0;
  fprintf(pFVar8,"sps->vui.video_full_range_flag: %d \n",uVar5);
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left - 1;
  b->bits_left = uVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    uVar6 = (ulong)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
  }
  if (uVar2 == 0) {
    b->p = pbVar1 + 1;
    b->bits_left = 8;
  }
  (sps->vui).colour_description_present_flag = (int)uVar6;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.colour_description_present_flag: %d \n",uVar6);
  if ((sps->vui).colour_description_present_flag == 0) goto LAB_00135579;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left;
  if (uVar2 == 8) {
    pbVar1 = b->p;
    pbVar7 = b->end;
    if (pbVar7 <= pbVar1) goto LAB_00135389;
    uVar11 = (uint)*pbVar1;
    b->p = pbVar1 + 1;
  }
  else {
    pbVar1 = b->p;
    pbVar7 = b->end;
LAB_00135389:
    uVar11 = 0;
    iVar3 = 7;
    do {
      uVar2 = uVar2 - 1;
      b->bits_left = uVar2;
      uVar9 = 0;
      if (pbVar1 < pbVar7) {
        uVar9 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
      }
      if (uVar2 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar2 = 8;
      }
      uVar11 = uVar11 | uVar9 << ((byte)iVar3 & 0x1f);
      bVar12 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while (bVar12);
  }
  (sps->vui).colour_primaries = uVar11;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.colour_primaries: %d \n");
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left;
  if (uVar2 == 8) {
    pbVar1 = b->p;
    pbVar7 = b->end;
    if (pbVar7 <= pbVar1) goto LAB_0013544a;
    uVar11 = (uint)*pbVar1;
    b->p = pbVar1 + 1;
  }
  else {
    pbVar1 = b->p;
    pbVar7 = b->end;
LAB_0013544a:
    uVar11 = 0;
    iVar3 = 7;
    do {
      uVar2 = uVar2 - 1;
      b->bits_left = uVar2;
      uVar9 = 0;
      if (pbVar1 < pbVar7) {
        uVar9 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
      }
      if (uVar2 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar2 = 8;
      }
      uVar11 = uVar11 | uVar9 << ((byte)iVar3 & 0x1f);
      bVar12 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while (bVar12);
  }
  (sps->vui).transfer_characteristics = uVar11;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.transfer_characteristics: %d \n");
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left;
  if (uVar2 == 8) {
    pbVar1 = b->p;
    pbVar7 = b->end;
    if (pbVar7 <= pbVar1) goto LAB_0013550b;
    uVar11 = (uint)*pbVar1;
    b->p = pbVar1 + 1;
  }
  else {
    pbVar1 = b->p;
    pbVar7 = b->end;
LAB_0013550b:
    uVar11 = 0;
    iVar3 = 7;
    do {
      uVar2 = uVar2 - 1;
      b->bits_left = uVar2;
      uVar9 = 0;
      if (pbVar1 < pbVar7) {
        uVar9 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
      }
      if (uVar2 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar2 = 8;
      }
      uVar11 = uVar11 | uVar9 << ((byte)iVar3 & 0x1f);
      bVar12 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while (bVar12);
  }
  (sps->vui).matrix_coefficients = uVar11;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.matrix_coefficients: %d \n");
LAB_00135579:
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar5 = 0;
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left - 1;
  b->bits_left = uVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    uVar5 = (ulong)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
  }
  if (uVar2 == 0) {
    b->p = pbVar1 + 1;
    b->bits_left = 8;
  }
  (sps->vui).chroma_loc_info_present_flag = (int)uVar5;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.chroma_loc_info_present_flag: %d \n",uVar5);
  if ((sps->vui).chroma_loc_info_present_flag != 0) {
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    iVar3 = 0;
    fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar1 = b->p;
    pbVar7 = b->end;
    uVar2 = b->bits_left;
    uVar11 = 0xffffffff;
    do {
      uVar2 = uVar2 - 1;
      b->bits_left = uVar2;
      bVar12 = true;
      if (pbVar1 < pbVar7) {
        bVar12 = (*pbVar1 >> (uVar2 & 0x1f) & 1) == 0;
      }
      if (uVar2 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar2 = 8;
      }
      uVar11 = uVar11 + 1;
      iVar3 = iVar3 + -1;
    } while (((bool)(bVar12 & uVar11 < 0x20)) && (pbVar1 < pbVar7));
    if (iVar3 == -1) {
      uVar11 = 0;
    }
    else {
      iVar4 = -2 - iVar3;
      iVar10 = -3 - iVar3;
      uVar11 = 0;
      do {
        uVar2 = uVar2 - 1;
        b->bits_left = uVar2;
        uVar9 = 0;
        if (pbVar1 < pbVar7) {
          uVar9 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
        }
        if (uVar2 == 0) {
          pbVar1 = pbVar1 + 1;
          b->p = pbVar1;
          b->bits_left = 8;
          uVar2 = 8;
        }
        uVar11 = uVar11 | uVar9 << ((byte)iVar4 & 0x1f);
        iVar10 = iVar10 + -1;
        iVar4 = iVar4 + -1;
      } while (iVar10 != -2);
    }
    uVar2 = 0xffffffff;
    (sps->vui).chroma_sample_loc_type_top_field = ~(-1 << (~(byte)iVar3 & 0x1f)) + uVar11;
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    iVar3 = 0;
    fprintf(pFVar8,"sps->vui.chroma_sample_loc_type_top_field: %d \n");
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar1 = b->p;
    pbVar7 = b->end;
    uVar11 = b->bits_left;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      bVar12 = true;
      if (pbVar1 < pbVar7) {
        bVar12 = (*pbVar1 >> (uVar11 & 0x1f) & 1) == 0;
      }
      if (uVar11 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar2 = uVar2 + 1;
      iVar3 = iVar3 + -1;
    } while (((bool)(bVar12 & uVar2 < 0x20)) && (pbVar1 < pbVar7));
    if (iVar3 == -1) {
      uVar2 = 0;
    }
    else {
      iVar4 = -2 - iVar3;
      iVar10 = -3 - iVar3;
      uVar2 = 0;
      do {
        uVar11 = uVar11 - 1;
        b->bits_left = uVar11;
        uVar9 = 0;
        if (pbVar1 < pbVar7) {
          uVar9 = (uint)((*pbVar1 >> (uVar11 & 0x1f) & 1) != 0);
        }
        if (uVar11 == 0) {
          pbVar1 = pbVar1 + 1;
          b->p = pbVar1;
          b->bits_left = 8;
          uVar11 = 8;
        }
        uVar2 = uVar2 | uVar9 << ((byte)iVar4 & 0x1f);
        iVar10 = iVar10 + -1;
        iVar4 = iVar4 + -1;
      } while (iVar10 != -2);
    }
    (sps->vui).chroma_sample_loc_type_bottom_field = ~(-1 << (~(byte)iVar3 & 0x1f)) + uVar2;
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    fprintf(pFVar8,"sps->vui.chroma_sample_loc_type_bottom_field: %d \n");
  }
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar5 = 0;
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left - 1;
  b->bits_left = uVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    uVar5 = (ulong)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
  }
  if (uVar2 == 0) {
    b->p = pbVar1 + 1;
    b->bits_left = 8;
  }
  (sps->vui).timing_info_present_flag = (int)uVar5;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.timing_info_present_flag: %d \n",uVar5);
  if ((sps->vui).timing_info_present_flag != 0) {
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    uVar11 = 0;
    fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar1 = b->p;
    uVar2 = b->bits_left;
    iVar3 = 0x1f;
    do {
      uVar2 = uVar2 - 1;
      b->bits_left = uVar2;
      uVar9 = 0;
      if (pbVar1 < b->end) {
        uVar9 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
      }
      if (uVar2 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar2 = 8;
      }
      uVar11 = uVar11 | uVar9 << ((byte)iVar3 & 0x1f);
      bVar12 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while (bVar12);
    (sps->vui).num_units_in_tick = uVar11;
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    uVar2 = 0;
    fprintf(pFVar8,"sps->vui.num_units_in_tick: %d \n",(ulong)uVar11);
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar1 = b->p;
    uVar11 = b->bits_left;
    iVar3 = 0x1f;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar9 = 0;
      if (pbVar1 < b->end) {
        uVar9 = (uint)((*pbVar1 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar2 = uVar2 | uVar9 << ((byte)iVar3 & 0x1f);
      bVar12 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while (bVar12);
    (sps->vui).time_scale = uVar2;
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    uVar5 = 0;
    fprintf(pFVar8,"sps->vui.time_scale: %d \n",(ulong)uVar2);
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar2 = b->bits_left - 1;
    b->bits_left = uVar2;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      uVar5 = (ulong)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
    }
    if (uVar2 == 0) {
      b->p = pbVar1 + 1;
      b->bits_left = 8;
    }
    (sps->vui).fixed_frame_rate_flag = (int)uVar5;
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    fprintf(pFVar8,"sps->vui.fixed_frame_rate_flag: %d \n",uVar5);
  }
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar11 = 0;
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left - 1;
  b->bits_left = uVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    uVar11 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
  }
  if (uVar2 == 0) {
    b->p = pbVar1 + 1;
    b->bits_left = 8;
  }
  (sps->vui).nal_hrd_parameters_present_flag = uVar11;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.nal_hrd_parameters_present_flag: %d \n",(ulong)uVar11);
  if ((sps->vui).nal_hrd_parameters_present_flag != 0) {
    read_debug_hrd_parameters(&sps->hrd_nal,b);
  }
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar5 = 0;
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left - 1;
  b->bits_left = uVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    uVar5 = (ulong)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
  }
  if (uVar2 == 0) {
    b->p = pbVar1 + 1;
    b->bits_left = 8;
  }
  (sps->vui).vcl_hrd_parameters_present_flag = (int)uVar5;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.vcl_hrd_parameters_present_flag: %d \n",uVar5);
  if ((sps->vui).vcl_hrd_parameters_present_flag != 0) {
    read_debug_hrd_parameters(&sps->hrd_vcl,b);
  }
  if (((sps->vui).nal_hrd_parameters_present_flag != 0) ||
     ((sps->vui).vcl_hrd_parameters_present_flag != 0)) {
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    uVar5 = 0;
    fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar2 = b->bits_left - 1;
    b->bits_left = uVar2;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      uVar5 = (ulong)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
    }
    if (uVar2 == 0) {
      b->p = pbVar1 + 1;
      b->bits_left = 8;
    }
    (sps->vui).low_delay_hrd_flag = (int)uVar5;
    pFVar8 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar8 = _stdout;
    }
    fprintf(pFVar8,"sps->vui.low_delay_hrd_flag: %d \n",uVar5);
  }
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar11 = 0;
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left - 1;
  b->bits_left = uVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    uVar11 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
  }
  if (uVar2 == 0) {
    b->p = pbVar1 + 1;
    b->bits_left = 8;
  }
  (sps->vui).pic_struct_present_flag = uVar11;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar2 = 0;
  fprintf(pFVar8,"sps->vui.pic_struct_present_flag: %d \n",(ulong)uVar11);
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar11 = b->bits_left - 1;
  b->bits_left = uVar11;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    uVar2 = (uint)((*pbVar1 >> (uVar11 & 0x1f) & 1) != 0);
  }
  if (uVar11 == 0) {
    b->p = pbVar1 + 1;
    b->bits_left = 8;
  }
  (sps->vui).bitstream_restriction_flag = uVar2;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.bitstream_restriction_flag: %d \n",(ulong)uVar2);
  if ((sps->vui).bitstream_restriction_flag == 0) {
    return;
  }
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  uVar11 = 0;
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar2 = b->bits_left - 1;
  b->bits_left = uVar2;
  pbVar1 = b->p;
  if (pbVar1 < b->end) {
    uVar11 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
  }
  if (uVar2 == 0) {
    b->p = pbVar1 + 1;
    b->bits_left = 8;
  }
  (sps->vui).motion_vectors_over_pic_boundaries_flag = uVar11;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  iVar3 = 0;
  fprintf(pFVar8,"sps->vui.motion_vectors_over_pic_boundaries_flag: %d \n",(ulong)uVar11);
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar1 = b->p;
  pbVar7 = b->end;
  uVar2 = b->bits_left;
  uVar11 = 0xffffffff;
  do {
    uVar2 = uVar2 - 1;
    b->bits_left = uVar2;
    bVar12 = true;
    if (pbVar1 < pbVar7) {
      bVar12 = (*pbVar1 >> (uVar2 & 0x1f) & 1) == 0;
    }
    if (uVar2 == 0) {
      pbVar1 = pbVar1 + 1;
      b->p = pbVar1;
      b->bits_left = 8;
      uVar2 = 8;
    }
    uVar11 = uVar11 + 1;
    iVar3 = iVar3 + -1;
  } while (((bool)(bVar12 & uVar11 < 0x20)) && (pbVar1 < pbVar7));
  if (iVar3 == -1) {
    uVar11 = 0;
  }
  else {
    iVar4 = -2 - iVar3;
    iVar10 = -3 - iVar3;
    uVar11 = 0;
    do {
      uVar2 = uVar2 - 1;
      b->bits_left = uVar2;
      uVar9 = 0;
      if (pbVar1 < pbVar7) {
        uVar9 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
      }
      if (uVar2 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar2 = 8;
      }
      uVar11 = uVar11 | uVar9 << ((byte)iVar4 & 0x1f);
      iVar10 = iVar10 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar10 != -2);
  }
  uVar2 = 0xffffffff;
  (sps->vui).max_bytes_per_pic_denom = ~(-1 << (~(byte)iVar3 & 0x1f)) + uVar11;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  iVar3 = 0;
  fprintf(pFVar8,"sps->vui.max_bytes_per_pic_denom: %d \n");
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar1 = b->p;
  pbVar7 = b->end;
  uVar11 = b->bits_left;
  do {
    uVar11 = uVar11 - 1;
    b->bits_left = uVar11;
    bVar12 = true;
    if (pbVar1 < pbVar7) {
      bVar12 = (*pbVar1 >> (uVar11 & 0x1f) & 1) == 0;
    }
    if (uVar11 == 0) {
      pbVar1 = pbVar1 + 1;
      b->p = pbVar1;
      b->bits_left = 8;
      uVar11 = 8;
    }
    uVar2 = uVar2 + 1;
    iVar3 = iVar3 + -1;
  } while (((bool)(bVar12 & uVar2 < 0x20)) && (pbVar1 < pbVar7));
  if (iVar3 == -1) {
    uVar2 = 0;
  }
  else {
    iVar4 = -2 - iVar3;
    iVar10 = -3 - iVar3;
    uVar2 = 0;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar9 = 0;
      if (pbVar1 < pbVar7) {
        uVar9 = (uint)((*pbVar1 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar2 = uVar2 | uVar9 << ((byte)iVar4 & 0x1f);
      iVar10 = iVar10 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar10 != -2);
  }
  uVar11 = 0xffffffff;
  (sps->vui).max_bits_per_mb_denom = ~(-1 << (~(byte)iVar3 & 0x1f)) + uVar2;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  iVar3 = 0;
  fprintf(pFVar8,"sps->vui.max_bits_per_mb_denom: %d \n");
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar1 = b->p;
  pbVar7 = b->end;
  uVar2 = b->bits_left;
  do {
    uVar2 = uVar2 - 1;
    b->bits_left = uVar2;
    bVar12 = true;
    if (pbVar1 < pbVar7) {
      bVar12 = (*pbVar1 >> (uVar2 & 0x1f) & 1) == 0;
    }
    if (uVar2 == 0) {
      pbVar1 = pbVar1 + 1;
      b->p = pbVar1;
      b->bits_left = 8;
      uVar2 = 8;
    }
    uVar11 = uVar11 + 1;
    iVar3 = iVar3 + -1;
  } while (((bool)(bVar12 & uVar11 < 0x20)) && (pbVar1 < pbVar7));
  if (iVar3 == -1) {
    uVar11 = 0;
  }
  else {
    iVar4 = -2 - iVar3;
    iVar10 = -3 - iVar3;
    uVar11 = 0;
    do {
      uVar2 = uVar2 - 1;
      b->bits_left = uVar2;
      uVar9 = 0;
      if (pbVar1 < pbVar7) {
        uVar9 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
      }
      if (uVar2 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar2 = 8;
      }
      uVar11 = uVar11 | uVar9 << ((byte)iVar4 & 0x1f);
      iVar10 = iVar10 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar10 != -2);
  }
  uVar2 = 0xffffffff;
  (sps->vui).log2_max_mv_length_horizontal = ~(-1 << (~(byte)iVar3 & 0x1f)) + uVar11;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  iVar3 = 0;
  fprintf(pFVar8,"sps->vui.log2_max_mv_length_horizontal: %d \n");
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar1 = b->p;
  pbVar7 = b->end;
  uVar11 = b->bits_left;
  do {
    uVar11 = uVar11 - 1;
    b->bits_left = uVar11;
    bVar12 = true;
    if (pbVar1 < pbVar7) {
      bVar12 = (*pbVar1 >> (uVar11 & 0x1f) & 1) == 0;
    }
    if (uVar11 == 0) {
      pbVar1 = pbVar1 + 1;
      b->p = pbVar1;
      b->bits_left = 8;
      uVar11 = 8;
    }
    uVar2 = uVar2 + 1;
    iVar3 = iVar3 + -1;
  } while (((bool)(bVar12 & uVar2 < 0x20)) && (pbVar1 < pbVar7));
  if (iVar3 == -1) {
    uVar2 = 0;
  }
  else {
    iVar4 = -2 - iVar3;
    iVar10 = -3 - iVar3;
    uVar2 = 0;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar9 = 0;
      if (pbVar1 < pbVar7) {
        uVar9 = (uint)((*pbVar1 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar2 = uVar2 | uVar9 << ((byte)iVar4 & 0x1f);
      iVar10 = iVar10 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar10 != -2);
  }
  uVar11 = 0xffffffff;
  (sps->vui).log2_max_mv_length_vertical = ~(-1 << (~(byte)iVar3 & 0x1f)) + uVar2;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  iVar3 = 0;
  fprintf(pFVar8,"sps->vui.log2_max_mv_length_vertical: %d \n");
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar1 = b->p;
  pbVar7 = b->end;
  uVar2 = b->bits_left;
  do {
    uVar2 = uVar2 - 1;
    b->bits_left = uVar2;
    bVar12 = true;
    if (pbVar1 < pbVar7) {
      bVar12 = (*pbVar1 >> (uVar2 & 0x1f) & 1) == 0;
    }
    if (uVar2 == 0) {
      pbVar1 = pbVar1 + 1;
      b->p = pbVar1;
      b->bits_left = 8;
      uVar2 = 8;
    }
    uVar11 = uVar11 + 1;
    iVar3 = iVar3 + -1;
  } while (((bool)(bVar12 & uVar11 < 0x20)) && (pbVar1 < pbVar7));
  if (iVar3 == -1) {
    uVar11 = 0;
  }
  else {
    iVar4 = -2 - iVar3;
    iVar10 = -3 - iVar3;
    uVar11 = 0;
    do {
      uVar2 = uVar2 - 1;
      b->bits_left = uVar2;
      uVar9 = 0;
      if (pbVar1 < pbVar7) {
        uVar9 = (uint)((*pbVar1 >> (uVar2 & 0x1f) & 1) != 0);
      }
      if (uVar2 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar2 = 8;
      }
      uVar11 = uVar11 | uVar9 << ((byte)iVar4 & 0x1f);
      iVar10 = iVar10 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar10 != -2);
  }
  uVar2 = 0xffffffff;
  (sps->vui).num_reorder_frames = ~(-1 << (~(byte)iVar3 & 0x1f)) + uVar11;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  iVar3 = 0;
  fprintf(pFVar8,"sps->vui.num_reorder_frames: %d \n");
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar1 = b->p;
  pbVar7 = b->end;
  uVar11 = b->bits_left;
  do {
    uVar11 = uVar11 - 1;
    b->bits_left = uVar11;
    bVar12 = true;
    if (pbVar1 < pbVar7) {
      bVar12 = (*pbVar1 >> (uVar11 & 0x1f) & 1) == 0;
    }
    if (uVar11 == 0) {
      pbVar1 = pbVar1 + 1;
      b->p = pbVar1;
      b->bits_left = 8;
      uVar11 = 8;
    }
    uVar2 = uVar2 + 1;
    iVar3 = iVar3 + -1;
  } while (((bool)(bVar12 & uVar2 < 0x20)) && (pbVar1 < pbVar7));
  if (iVar3 == -1) {
    uVar2 = 0;
  }
  else {
    iVar4 = -2 - iVar3;
    iVar10 = -3 - iVar3;
    uVar2 = 0;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar9 = 0;
      if (pbVar1 < pbVar7) {
        uVar9 = (uint)((*pbVar1 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar1 = pbVar1 + 1;
        b->p = pbVar1;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar2 = uVar2 | uVar9 << ((byte)iVar4 & 0x1f);
      iVar10 = iVar10 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar10 != -2);
  }
  (sps->vui).max_dec_frame_buffering = ~(-1 << (~(byte)iVar3 & 0x1f)) + uVar2;
  pFVar8 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar8 = _stdout;
  }
  fprintf(pFVar8,"sps->vui.max_dec_frame_buffering: %d \n");
  return;
}

Assistant:

void read_debug_vui_parameters(sps_t* sps, bs_t* b)
{
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.aspect_ratio_info_present_flag = bs_read_u1(b); printf("sps->vui.aspect_ratio_info_present_flag: %d \n", sps->vui.aspect_ratio_info_present_flag); 
    if( sps->vui.aspect_ratio_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.aspect_ratio_idc = bs_read_u8(b); printf("sps->vui.aspect_ratio_idc: %d \n", sps->vui.aspect_ratio_idc); 
        if( sps->vui.aspect_ratio_idc == SAR_Extended )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.sar_width = bs_read_u(b, 16); printf("sps->vui.sar_width: %d \n", sps->vui.sar_width); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.sar_height = bs_read_u(b, 16); printf("sps->vui.sar_height: %d \n", sps->vui.sar_height); 
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.overscan_info_present_flag = bs_read_u1(b); printf("sps->vui.overscan_info_present_flag: %d \n", sps->vui.overscan_info_present_flag); 
    if( sps->vui.overscan_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.overscan_appropriate_flag = bs_read_u1(b); printf("sps->vui.overscan_appropriate_flag: %d \n", sps->vui.overscan_appropriate_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.video_signal_type_present_flag = bs_read_u1(b); printf("sps->vui.video_signal_type_present_flag: %d \n", sps->vui.video_signal_type_present_flag); 
    if( sps->vui.video_signal_type_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.video_format = bs_read_u(b, 3); printf("sps->vui.video_format: %d \n", sps->vui.video_format); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.video_full_range_flag = bs_read_u1(b); printf("sps->vui.video_full_range_flag: %d \n", sps->vui.video_full_range_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.colour_description_present_flag = bs_read_u1(b); printf("sps->vui.colour_description_present_flag: %d \n", sps->vui.colour_description_present_flag); 
        if( sps->vui.colour_description_present_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.colour_primaries = bs_read_u8(b); printf("sps->vui.colour_primaries: %d \n", sps->vui.colour_primaries); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.transfer_characteristics = bs_read_u8(b); printf("sps->vui.transfer_characteristics: %d \n", sps->vui.transfer_characteristics); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.matrix_coefficients = bs_read_u8(b); printf("sps->vui.matrix_coefficients: %d \n", sps->vui.matrix_coefficients); 
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.chroma_loc_info_present_flag = bs_read_u1(b); printf("sps->vui.chroma_loc_info_present_flag: %d \n", sps->vui.chroma_loc_info_present_flag); 
    if( sps->vui.chroma_loc_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.chroma_sample_loc_type_top_field = bs_read_ue(b); printf("sps->vui.chroma_sample_loc_type_top_field: %d \n", sps->vui.chroma_sample_loc_type_top_field); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.chroma_sample_loc_type_bottom_field = bs_read_ue(b); printf("sps->vui.chroma_sample_loc_type_bottom_field: %d \n", sps->vui.chroma_sample_loc_type_bottom_field); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.timing_info_present_flag = bs_read_u1(b); printf("sps->vui.timing_info_present_flag: %d \n", sps->vui.timing_info_present_flag); 
    if( sps->vui.timing_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.num_units_in_tick = bs_read_u(b, 32); printf("sps->vui.num_units_in_tick: %d \n", sps->vui.num_units_in_tick); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.time_scale = bs_read_u(b, 32); printf("sps->vui.time_scale: %d \n", sps->vui.time_scale); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.fixed_frame_rate_flag = bs_read_u1(b); printf("sps->vui.fixed_frame_rate_flag: %d \n", sps->vui.fixed_frame_rate_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.nal_hrd_parameters_present_flag = bs_read_u1(b); printf("sps->vui.nal_hrd_parameters_present_flag: %d \n", sps->vui.nal_hrd_parameters_present_flag); 
    if( sps->vui.nal_hrd_parameters_present_flag )
    {
        read_debug_hrd_parameters(&sps->hrd_nal, b);
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.vcl_hrd_parameters_present_flag = bs_read_u1(b); printf("sps->vui.vcl_hrd_parameters_present_flag: %d \n", sps->vui.vcl_hrd_parameters_present_flag); 
    if( sps->vui.vcl_hrd_parameters_present_flag )
    {
        read_debug_hrd_parameters(&sps->hrd_vcl, b);
    }
    if( sps->vui.nal_hrd_parameters_present_flag || sps->vui.vcl_hrd_parameters_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.low_delay_hrd_flag = bs_read_u1(b); printf("sps->vui.low_delay_hrd_flag: %d \n", sps->vui.low_delay_hrd_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.pic_struct_present_flag = bs_read_u1(b); printf("sps->vui.pic_struct_present_flag: %d \n", sps->vui.pic_struct_present_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.bitstream_restriction_flag = bs_read_u1(b); printf("sps->vui.bitstream_restriction_flag: %d \n", sps->vui.bitstream_restriction_flag); 
    if( sps->vui.bitstream_restriction_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.motion_vectors_over_pic_boundaries_flag = bs_read_u1(b); printf("sps->vui.motion_vectors_over_pic_boundaries_flag: %d \n", sps->vui.motion_vectors_over_pic_boundaries_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.max_bytes_per_pic_denom = bs_read_ue(b); printf("sps->vui.max_bytes_per_pic_denom: %d \n", sps->vui.max_bytes_per_pic_denom); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.max_bits_per_mb_denom = bs_read_ue(b); printf("sps->vui.max_bits_per_mb_denom: %d \n", sps->vui.max_bits_per_mb_denom); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.log2_max_mv_length_horizontal = bs_read_ue(b); printf("sps->vui.log2_max_mv_length_horizontal: %d \n", sps->vui.log2_max_mv_length_horizontal); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.log2_max_mv_length_vertical = bs_read_ue(b); printf("sps->vui.log2_max_mv_length_vertical: %d \n", sps->vui.log2_max_mv_length_vertical); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.num_reorder_frames = bs_read_ue(b); printf("sps->vui.num_reorder_frames: %d \n", sps->vui.num_reorder_frames); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.max_dec_frame_buffering = bs_read_ue(b); printf("sps->vui.max_dec_frame_buffering: %d \n", sps->vui.max_dec_frame_buffering); 
    }
}